

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O3

void __thiscall ncnn::Convolution_x86::destroy_pipeline(Convolution_x86 *this)

{
  Option *in_RSI;
  
  destroy_pipeline((Convolution_x86 *)
                   ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-7]),
                   in_RSI);
  return;
}

Assistant:

int Convolution_x86::destroy_pipeline(const Option& opt)
{
    Option opt_cpu = opt;
    opt_cpu.vulkan_compute = false;

    if (activation)
    {
        activation->destroy_pipeline(opt_cpu);
        delete activation;
        activation = 0;
    }

    return 0;
}